

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<std::array<tinyusdz::value::half,3ul>>
          (Attribute *this,array<tinyusdz::value::half,_3UL> *v)

{
  value_type *pvVar1;
  optional<std::array<tinyusdz::value::half,_3UL>_> ret;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_28;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_20;
  
  if (v == (array<tinyusdz::value::half,_3UL> *)0x0) {
    local_28.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,3ul>>(&local_28,&this->_var);
    local_20.has_value_ = local_28.has_value_;
    if (local_28.has_value_ != false) {
      local_20.contained._4_2_ = local_28.contained._4_2_;
      local_20.contained._0_4_ = local_28.contained._0_4_;
      pvVar1 = nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::value
                         (&local_20);
      *(undefined4 *)v->_M_elems = *(undefined4 *)pvVar1->_M_elems;
      v->_M_elems[2].value = pvVar1->_M_elems[2].value;
    }
  }
  return local_28.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }